

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_MapEntryPartialTest_Test::TestBody
          (ComparisonTest_MapEntryPartialTest_Test *this)

{
  internal iVar1;
  bool bVar2;
  pointer *__ptr;
  char *message;
  char *in_R9;
  pointer *__ptr_1;
  string_view input;
  string_view input_00;
  string_view input_01;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string output;
  Parser parser;
  MessageDifferencer differencer;
  TestMap map1;
  TestMap map2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_9a8;
  AssertHelper local_9a0;
  Message local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_990;
  undefined1 local_988 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_980;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_978;
  string local_968;
  Parser local_948;
  MessageDifferencer local_918;
  TestMap local_768;
  TestMap local_3c0;
  
  TextFormat::Parser::Parser(&local_948);
  proto2_unittest::TestMap::TestMap(&local_768,(Arena *)0x0);
  proto2_unittest::TestMap::TestMap(&local_3c0,(Arena *)0x0);
  local_968._M_string_length = 0;
  local_968.field_2._M_local_buf[0] = '\0';
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  util::MessageDifferencer::MessageDifferencer(&local_918);
  util::MessageDifferencer::set_scope(&local_918,PARTIAL);
  util::MessageDifferencer::ReportDifferencesToString(&local_918,&local_968);
  input._M_str = "map_int32_foreign_message { key: 1 value { c: 1 } }";
  input._M_len = 0x33;
  iVar1 = (internal)TextFormat::Parser::ParseFromString(&local_948,input,&local_768.super_Message);
  local_990 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_998.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)&local_9a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_988,(internal *)&local_998,
               (AssertionResult *)
               "parser.ParseFromString( \"map_int32_foreign_message { key: 1 value { c: 1 } }\", &map1)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xf1d,(char *)CONCAT71(local_988._1_7_,local_988[0]));
    testing::internal::AssertHelper::operator=(&local_9a0,(Message *)&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_988._1_7_,local_988[0]) != &local_978) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_988._1_7_,local_988[0]),local_978._M_allocated_capacity + 1)
      ;
    }
    if (local_9a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_9a8._M_head_impl + 8))();
    }
    if (local_990 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_990,local_990);
    }
    if (!(bool)iVar1) goto LAB_00bb503b;
  }
  input_00._M_str = "map_int32_foreign_message { key: 1 value { c: 2 }}";
  input_00._M_len = 0x32;
  iVar1 = (internal)
          TextFormat::Parser::ParseFromString(&local_948,input_00,&local_3c0.super_Message);
  local_990 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_998.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)&local_9a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_988,(internal *)&local_998,
               (AssertionResult *)
               "parser.ParseFromString( \"map_int32_foreign_message { key: 1 value { c: 2 }}\", &map2)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xf1f,(char *)CONCAT71(local_988._1_7_,local_988[0]));
    testing::internal::AssertHelper::operator=(&local_9a0,(Message *)&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_988._1_7_,local_988[0]) != &local_978) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_988._1_7_,local_988[0]),local_978._M_allocated_capacity + 1)
      ;
    }
    if (local_9a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_9a8._M_head_impl + 8))();
    }
    if (local_990 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_990,local_990);
    }
    if (!(bool)iVar1) goto LAB_00bb503b;
  }
  bVar2 = util::MessageDifferencer::Compare
                    (&local_918,&local_768.super_Message,&local_3c0.super_Message);
  local_998.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar2;
  local_990 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_9a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_988,(internal *)&local_998,
               (AssertionResult *)"differencer.Compare(map1, map2)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xf20,(char *)CONCAT71(local_988._1_7_,local_988[0]));
    testing::internal::AssertHelper::operator=(&local_9a0,(Message *)&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_988._1_7_,local_988[0]) != &local_978) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_988._1_7_,local_988[0]),local_978._M_allocated_capacity + 1)
      ;
    }
    if (local_9a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_9a8._M_head_impl + 8))();
    }
  }
  if (local_990 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_990,local_990);
  }
  testing::internal::CmpHelperEQ<char[50],std::__cxx11::string>
            ((internal *)local_988,"\"modified: map_int32_foreign_message[1].c: 1 -> 2\\n\"",
             "output",(char (*) [50])"modified: map_int32_foreign_message[1].c: 1 -> 2\n",&local_968
            );
  if (local_988[0] == (internal)0x0) {
    testing::Message::Message(&local_998);
    if (local_980 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_980->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_9a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xf21,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_9a8,&local_998);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_9a8);
    if ((long *)CONCAT71(local_998.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_998.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_998.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_998.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_980 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_980,local_980);
  }
  input_01._M_str = "map_int32_foreign_message { key: 1 }";
  input_01._M_len = 0x24;
  iVar1 = (internal)
          TextFormat::Parser::ParseFromString(&local_948,input_01,&local_768.super_Message);
  local_990 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_998.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)&local_9a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_988,(internal *)&local_998,
               (AssertionResult *)
               "parser.ParseFromString(\"map_int32_foreign_message { key: 1 }\", &map1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xf24,(char *)CONCAT71(local_988._1_7_,local_988[0]));
    testing::internal::AssertHelper::operator=(&local_9a0,(Message *)&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_988._1_7_,local_988[0]) != &local_978) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_988._1_7_,local_988[0]),local_978._M_allocated_capacity + 1)
      ;
    }
    if (local_9a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_9a8._M_head_impl + 8))();
    }
    if (local_990 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_990,local_990);
    }
    if (!(bool)iVar1) goto LAB_00bb503b;
  }
  local_998.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       util::MessageDifferencer::Compare
                 (&local_918,&local_768.super_Message,&local_3c0.super_Message);
  local_990 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_998.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_9a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_988,(internal *)&local_998,
               (AssertionResult *)"differencer.Compare(map1, map2)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xf25,(char *)CONCAT71(local_988._1_7_,local_988[0]));
    testing::internal::AssertHelper::operator=(&local_9a0,(Message *)&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_988._1_7_,local_988[0]) != &local_978) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_988._1_7_,local_988[0]),local_978._M_allocated_capacity + 1)
      ;
    }
    if (local_9a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_9a8._M_head_impl + 8))();
    }
  }
  if (local_990 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_990,local_990);
  }
LAB_00bb503b:
  util::MessageDifferencer::~MessageDifferencer(&local_918);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,
                    CONCAT71(local_968.field_2._M_allocated_capacity._1_7_,
                             local_968.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestMap::~TestMap(&local_3c0);
  proto2_unittest::TestMap::~TestMap(&local_768);
  TextFormat::Parser::~Parser(&local_948);
  return;
}

Assistant:

TEST_F(ComparisonTest, MapEntryPartialTest) {
  TextFormat::Parser parser;
  unittest::TestMap map1;
  unittest::TestMap map2;

  std::string output;
  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.ReportDifferencesToString(&output);

  ASSERT_TRUE(parser.ParseFromString(
      "map_int32_foreign_message { key: 1 value { c: 1 } }", &map1));
  ASSERT_TRUE(parser.ParseFromString(
      "map_int32_foreign_message { key: 1 value { c: 2 }}", &map2));
  EXPECT_FALSE(differencer.Compare(map1, map2));
  EXPECT_EQ("modified: map_int32_foreign_message[1].c: 1 -> 2\n", output);

  ASSERT_TRUE(
      parser.ParseFromString("map_int32_foreign_message { key: 1 }", &map1));
  EXPECT_TRUE(differencer.Compare(map1, map2));
}